

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O3

OPJ_BOOL opj_tcd_makelayer(opj_tcd_t *tcd,OPJ_UINT32 layno,OPJ_FLOAT64 thresh,OPJ_UINT32 final)

{
  long *plVar1;
  uint uVar2;
  uint uVar3;
  opj_tcd_image_t *poVar4;
  opj_tcd_tile_t *poVar5;
  OPJ_FLOAT64 OVar6;
  long lVar7;
  bool bVar8;
  ulong uVar9;
  uint uVar10;
  double *pdVar11;
  int *piVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  double dVar29;
  OPJ_BOOL local_b0;
  
  uVar9 = (ulong)layno;
  (&tcd->tcp)[uVar9] = (opj_tcp_t *)0x0;
  uVar2 = tcd->cur_pino;
  if ((ulong)uVar2 == 0) {
    local_b0 = 1;
  }
  else {
    poVar4 = tcd->tcd_image;
    local_b0 = 1;
    uVar23 = 0;
    do {
      uVar24 = (ulong)*(uint *)((long)&poVar4[uVar23 * 0xe + 2].tiles + 4);
      if (uVar24 != 0) {
        poVar5 = poVar4[uVar23 * 0xe + 4].tiles;
        uVar17 = 0;
        do {
          uVar3 = *(uint *)(poVar5->distolayer + uVar17 * 0x18 + -3);
          if ((ulong)uVar3 != 0) {
            uVar14 = 0;
            do {
              if (((*(int *)(poVar5->distolayer + uVar17 * 0x18 + uVar14 * 6 + -1) !=
                    *(int *)(poVar5->distolayer + uVar17 * 0x18 + uVar14 * 6 + -2)) &&
                  (lVar16 = uVar14 * 0x30 + uVar17 * 0xc0 + 0x20,
                  *(int *)((long)poVar5->distolayer + lVar16 + -0x24) !=
                  *(int *)((long)poVar5->distolayer + lVar16 + -0x2c))) &&
                 (uVar15 = *(int *)((long)poVar5->distolayer + uVar17 * 0xc0 + -0x1c) *
                           *(int *)(poVar5->distolayer + uVar17 * 0x18 + -4), uVar15 != 0)) {
                OVar6 = poVar5->distolayer[uVar17 * 0x18 + uVar14 * 6 + 1];
                uVar13 = 0;
                do {
                  lVar16 = uVar13 * 0x38;
                  uVar10 = *(int *)((long)OVar6 + 0x14 + lVar16) *
                           *(int *)((long)OVar6 + 0x10 + lVar16);
                  if (uVar10 != 0) {
                    uVar25 = 0;
                    do {
                      lVar7 = *(long *)(lVar16 + (long)OVar6 + 0x18);
                      plVar1 = (long *)(uVar25 * 0x40 + lVar7);
                      if (layno == 0) {
                        *(undefined4 *)(plVar1 + 7) = 0;
                      }
                      if (0.0 <= (double)thresh) {
                        uVar26 = *(uint *)(plVar1 + 7);
                        uVar20 = (ulong)uVar26;
                        uVar18 = uVar26;
                        if (uVar26 < *(uint *)((long)plVar1 + 0x3c)) {
                          lVar27 = plVar1[2];
                          pdVar11 = (double *)(lVar27 + uVar20 * 0x18 + 8);
                          uVar28 = uVar20;
                          do {
                            uVar18 = *(uint *)(pdVar11 + -1);
                            uVar19 = (uint)uVar20;
                            if (uVar19 == 0) {
                              dVar29 = *pdVar11;
                            }
                            else {
                              uVar18 = uVar18 - *(int *)(lVar27 + (ulong)(uVar19 - 1) * 0x18);
                              dVar29 = *pdVar11 -
                                       *(double *)(lVar27 + 8 + (ulong)(uVar19 - 1) * 0x18);
                            }
                            if (uVar18 == 0) {
                              bVar8 = dVar29 != 0.0;
                            }
                            else {
                              bVar8 = (double)thresh - dVar29 / (double)uVar18 <
                                      2.220446049250313e-16;
                            }
                            uVar28 = uVar28 + 1;
                            uVar18 = (uint)uVar28;
                            if (!bVar8) {
                              uVar18 = uVar19;
                            }
                            pdVar11 = pdVar11 + 3;
                            uVar20 = (ulong)uVar18;
                          } while (*(uint *)((long)plVar1 + 0x3c) != uVar28);
                        }
                      }
                      else {
                        uVar26 = *(uint *)(plVar1 + 7);
                        uVar18 = *(uint *)((long)plVar1 + 0x3c);
                      }
                      piVar12 = (int *)(uVar9 * 0x18 + *(long *)(lVar7 + 8 + uVar25 * 0x40));
                      iVar21 = uVar18 - uVar26;
                      iVar22 = *piVar12;
                      if (*piVar12 != iVar21) {
                        *piVar12 = iVar21;
                        local_b0 = 0;
                        iVar22 = iVar21;
                      }
                      if (iVar22 == 0) {
                        piVar12[2] = 0;
                        piVar12[3] = 0;
                      }
                      else {
                        uVar20 = (ulong)(uVar18 - 1);
                        lVar7 = plVar1[2];
                        iVar22 = *(int *)(lVar7 + uVar20 * 0x18);
                        if (uVar26 == 0) {
                          lVar27 = *plVar1;
                          dVar29 = *(double *)(lVar7 + 8 + uVar20 * 0x18);
                        }
                        else {
                          uVar19 = *(uint *)(lVar7 + (ulong)(uVar26 - 1) * 0x18);
                          iVar22 = iVar22 - uVar19;
                          lVar27 = (ulong)uVar19 + *plVar1;
                          dVar29 = *(double *)(lVar7 + 8 + uVar20 * 0x18) -
                                   *(double *)(lVar7 + 8 + (ulong)(uVar26 - 1) * 0x18);
                        }
                        piVar12[1] = iVar22;
                        *(long *)(piVar12 + 4) = lVar27;
                        *(double *)(piVar12 + 2) = dVar29;
                        (&tcd->tcp)[uVar9] = (opj_tcp_t *)(dVar29 + (double)(&tcd->tcp)[uVar9]);
                        if (final != 0) {
                          *(uint *)(plVar1 + 7) = uVar18;
                        }
                      }
                      uVar25 = uVar25 + 1;
                    } while (uVar25 != uVar10);
                  }
                  uVar13 = uVar13 + 1;
                } while (uVar13 != uVar15);
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar3);
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar24);
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 != uVar2);
  }
  return local_b0;
}

Assistant:

static
OPJ_BOOL opj_tcd_makelayer(opj_tcd_t *tcd,
                           OPJ_UINT32 layno,
                           OPJ_FLOAT64 thresh,
                           OPJ_UINT32 final)
{
    OPJ_UINT32 compno, resno, bandno, precno, cblkno;
    OPJ_UINT32 passno;

    opj_tcd_tile_t *tcd_tile = tcd->tcd_image->tiles;
    OPJ_BOOL layer_allocation_is_same = OPJ_TRUE;

    tcd_tile->distolayer[layno] = 0;

    for (compno = 0; compno < tcd_tile->numcomps; compno++) {
        opj_tcd_tilecomp_t *tilec = &tcd_tile->comps[compno];

        for (resno = 0; resno < tilec->numresolutions; resno++) {
            opj_tcd_resolution_t *res = &tilec->resolutions[resno];

            for (bandno = 0; bandno < res->numbands; bandno++) {
                opj_tcd_band_t *band = &res->bands[bandno];

                /* Skip empty bands */
                if (opj_tcd_is_band_empty(band)) {
                    continue;
                }

                for (precno = 0; precno < res->pw * res->ph; precno++) {
                    opj_tcd_precinct_t *prc = &band->precincts[precno];

                    for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
                        opj_tcd_cblk_enc_t *cblk = &prc->cblks.enc[cblkno];
                        opj_tcd_layer_t *layer = &cblk->layers[layno];
                        OPJ_UINT32 n;

                        if (layno == 0) {
                            cblk->numpassesinlayers = 0;
                        }

                        n = cblk->numpassesinlayers;

                        if (thresh < 0) {
                            /* Special value to indicate to use all passes */
                            n = cblk->totalpasses;
                        } else {
                            for (passno = cblk->numpassesinlayers; passno < cblk->totalpasses; passno++) {
                                OPJ_UINT32 dr;
                                OPJ_FLOAT64 dd;
                                opj_tcd_pass_t *pass = &cblk->passes[passno];

                                if (n == 0) {
                                    dr = pass->rate;
                                    dd = pass->distortiondec;
                                } else {
                                    dr = pass->rate - cblk->passes[n - 1].rate;
                                    dd = pass->distortiondec - cblk->passes[n - 1].distortiondec;
                                }

                                if (!dr) {
                                    if (dd != 0) {
                                        n = passno + 1;
                                    }
                                    continue;
                                }
                                if (thresh - (dd / dr) <
                                        DBL_EPSILON) { /* do not rely on float equality, check with DBL_EPSILON margin */
                                    n = passno + 1;
                                }
                            }
                        }

                        if (layer->numpasses != n - cblk->numpassesinlayers) {
                            layer_allocation_is_same = OPJ_FALSE;
                            layer->numpasses = n - cblk->numpassesinlayers;
                        }

                        if (!layer->numpasses) {
                            layer->disto = 0;
                            continue;
                        }

                        if (cblk->numpassesinlayers == 0) {
                            layer->len = cblk->passes[n - 1].rate;
                            layer->data = cblk->data;
                            layer->disto = cblk->passes[n - 1].distortiondec;
                        } else {
                            layer->len = cblk->passes[n - 1].rate - cblk->passes[cblk->numpassesinlayers -
                                         1].rate;
                            layer->data = cblk->data + cblk->passes[cblk->numpassesinlayers - 1].rate;
                            layer->disto = cblk->passes[n - 1].distortiondec -
                                           cblk->passes[cblk->numpassesinlayers - 1].distortiondec;
                        }

                        tcd_tile->distolayer[layno] += layer->disto;

                        if (final) {
                            cblk->numpassesinlayers = n;
                        }
                    }
                }
            }
        }
    }
    return layer_allocation_is_same;
}